

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int thread_tcache_flush_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != true) {
    return 0xe;
  }
  if (((oldp == (void *)0x0 && oldlenp == (size_t *)0x0) && newp == (void *)0x0) && newlen == 0) {
    duckdb_je_tcache_flush(tsd);
  }
  return (uint)(((oldp != (void *)0x0 || oldlenp != (size_t *)0x0) || newp != (void *)0x0) ||
               newlen != 0);
}

Assistant:

static int
thread_tcache_flush_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;

	if (!tcache_available(tsd)) {
		ret = EFAULT;
		goto label_return;
	}

	NEITHER_READ_NOR_WRITE();

	tcache_flush(tsd);

	ret = 0;
label_return:
	return ret;
}